

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

bool __thiscall
MetricsDiscovery::MDHelper::InitMetricsDiscovery
          (MDHelper *this,string *metricsLibraryName,string *metricSetSymbolName,
          string *metricsFileName,uint32_t adapterIndex,bool includeMaxValues)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  byte in_R9B;
  string *unaff_retaddr;
  bool success;
  void *pLibrary;
  bool local_39;
  uint32_t adapterIndex_00;
  string *metricSetSymbolName_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  adapterIndex_00 = (uint32_t)((ulong)in_RDX >> 0x20);
  in_RDI[0x20] = (string)0x0;
  in_RDI[0x22] = (string)(in_R9B & 1);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  if (((*(uint *)(in_RDI + 0x24) & 1) == 0) || (*(int *)(in_RDI + 0x24) == 1)) {
    metricSetSymbolName_00 = in_RDI;
    pvVar1 = OpenLibrary(unaff_retaddr);
    if (pvVar1 == (void *)0x0) {
      bVar3 = false;
    }
    else {
      uVar2 = dlsym(pvVar1,"OpenAdapterGroup");
      *(undefined8 *)in_RDI = uVar2;
      uVar2 = dlsym(pvVar1,"OpenMetricsDevice");
      *(undefined8 *)(in_RDI + 8) = uVar2;
      if (*(long *)(in_RDI + 8) == 0) {
        bVar3 = false;
      }
      else {
        uVar2 = dlsym(pvVar1,"OpenMetricsDeviceFromFile");
        *(undefined8 *)(in_RDI + 0x10) = uVar2;
        if (*(long *)(in_RDI + 0x10) == 0) {
          bVar3 = false;
        }
        else {
          uVar2 = dlsym(pvVar1,"CloseMetricsDevice");
          *(undefined8 *)(in_RDI + 0x18) = uVar2;
          if (*(long *)(in_RDI + 0x18) == 0) {
            bVar3 = false;
          }
          else {
            local_39 = InitMetricsDiscoveryAdapterGroup
                                 ((MDHelper *)
                                  CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                  metricSetSymbolName_00,in_RSI,adapterIndex_00);
            if (!local_39) {
              local_39 = InitMetricsDiscoveryLegacy
                                   ((MDHelper *)
                                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                    metricSetSymbolName_00,in_RSI);
            }
            if (local_39 != false) {
              (**(code **)(**(long **)(in_RDI + 0x50) + 0x48))
                        (*(long **)(in_RDI + 0x50),*(undefined4 *)(in_RDI + 0x24));
              in_RDI[0x20] = (string)0x1;
            }
            bVar3 = (bool)((byte)in_RDI[0x20] & 1);
          }
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MDHelper::InitMetricsDiscovery(
    const std::string& metricsLibraryName,
    const std::string& metricSetSymbolName,
    const std::string& metricsFileName,
    uint32_t adapterIndex,
    bool includeMaxValues )
{
    m_Initialized = false;
    m_IncludeMaxValues = includeMaxValues;

    OpenAdapterGroup = NULL;
    OpenMetricsDevice = NULL;
    OpenMetricsDeviceFromFile = NULL;
    CloseMetricsDevice = NULL;

    if (m_APIMask & API_TYPE_IOSTREAM && m_APIMask != API_TYPE_IOSTREAM)
    {
        DebugPrint("API type IOSTREAM cannot be combined with any other API type.\n");
        return false;
    }

    // Open the MDAPI library from the passed-in file name if provided, or from
    // a default file name otherwise.
    void* pLibrary = OpenLibrary(metricsLibraryName);
    if (pLibrary == NULL)
    {
        DebugPrint("Couldn't load metrics discovery library!\n");
        return false;
    }

    OpenAdapterGroup = (OpenAdapterGroup_fn)GetFunctionAddress(pLibrary, "OpenAdapterGroup");
    if (OpenAdapterGroup == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenAdapterGroup!\n");
        // OpenAdapterGroup is a newer function that is not supported by older MDAPI.
    }

    OpenMetricsDevice = (OpenMetricsDevice_fn)GetFunctionAddress(pLibrary, "OpenMetricsDevice");
    if (OpenMetricsDevice == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenMetricsDevice!\n");
        return false;
    }

    OpenMetricsDeviceFromFile = (OpenMetricsDeviceFromFile_fn)GetFunctionAddress(pLibrary, "OpenMetricsDeviceFromFile");
    if (OpenMetricsDeviceFromFile == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenMetricsDeviceFromFile!\n");
        return false;
    }

    CloseMetricsDevice = (CloseMetricsDevice_fn)GetFunctionAddress(pLibrary, "CloseMetricsDevice");
    if (CloseMetricsDevice == NULL)
    {
        DebugPrint("Couldn't get pointer to CloseMetricsDevice!\n");
        return false;
    }

    DebugPrint("InitMetricsDiscoveryAdapterGroup for adapter index %u...\n", adapterIndex);
    bool success = InitMetricsDiscoveryAdapterGroup(
        metricSetSymbolName,
        metricsFileName,
        adapterIndex );
    if (!success)
    {
        DebugPrint("InitMetricsDiscoveryLegacy...\n", adapterIndex);
        success = InitMetricsDiscoveryLegacy(
            metricSetSymbolName,
            metricsFileName );
    }

    if (success)
    {
        m_MetricSet->SetApiFiltering( m_APIMask );
        m_Initialized = true;
    }

    DebugPrint("MetricsDiscoveryInit End\n");
    return m_Initialized;
}